

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O1

void testExpression(string *expr,double value)

{
  pointer *__ptr;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this;
  char *pcVar1;
  AssertionResult gtest_ar_1;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> node;
  NumberValueAnalyser analyser;
  Parser parser;
  Executor executor;
  stringstream stream;
  AssertHelper local_458;
  Message local_450;
  undefined1 local_448 [16];
  AssertHelper local_438;
  undefined **local_430;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_428;
  Parser local_408;
  undefined1 local_3c0 [560];
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  local_428._24_8_ = value;
  std::__cxx11::stringstream::stringstream(local_190,(string *)expr,_S_out|_S_in);
  Parser::Parser(&local_408,(istream *)local_190);
  Parser::parseLogicalExpression((Parser *)(local_448 + 8));
  Executor::Executor((Executor *)local_3c0);
  (**(code **)(*(long *)local_448._8_8_ + 0x10))(local_448._8_8_,local_3c0);
  local_450.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<TypeName,TypeName>
            ((internal *)&local_430,"val->getType()","TypeName::F32",
             (TypeName *)(local_3c0._8_8_ + 8),(TypeName *)&local_450);
  if ((internal)local_430._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_450);
    if ((undefined8 *)CONCAT71(local_428._1_7_,local_428._M_first._M_storage._M_storage[0]) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(local_428._1_7_,local_428._M_first._M_storage._M_storage[0]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/ExecutorTests.cpp"
               ,0x11,pcVar1);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    if ((long *)CONCAT44(local_450.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_450.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_450.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_450.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    local_448._1_7_ = local_428._1_7_;
    local_448[0] = local_428._M_first._M_storage._M_storage[0];
    if ((_Variadic_union<double>)local_448._0_8_ == (_Variadic_union<double>)0x0) goto LAB_0018c142;
    this = &local_428;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_428._1_7_,local_428._M_first._M_storage._M_storage[0]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428._M_first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_428._1_7_,local_428._M_first._M_storage._M_storage[0]));
    }
    local_430 = &PTR__ValueVisitor_001f52a8;
    local_428._M_first._M_storage._M_storage[0] = '\0';
    local_428._M_first._M_storage._M_storage[0x10] = '\0';
    (*(*(_func_int ***)local_3c0._8_8_)[3])();
    if (local_428._M_first._M_storage._M_storage[0x10] == '\0') {
      std::__throw_bad_optional_access();
    }
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_450,"res","value",(double)local_428._8_8_,(double)local_428._24_8_
              );
    if (local_450.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_458);
      if ((_Variadic_union<double>)local_448._0_8_ == (_Variadic_union<double>)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)local_448._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/ExecutorTests.cpp"
                 ,0x16,pcVar1);
      testing::internal::AssertHelper::operator=(&local_438,(Message *)&local_458);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      if (local_458.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_458.data_ + 8))();
      }
    }
    if ((_Variadic_union<double>)local_448._0_8_ == (_Variadic_union<double>)0x0) goto LAB_0018c142;
    this = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
            *)local_448;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&this->_M_first,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448._0_8_);
LAB_0018c142:
  local_3c0._0_8_ = &PTR__Executor_001f4940;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_3c0 + 0xb0));
  std::ios_base::~ios_base((ios_base *)(local_3c0 + 0x120));
  std::
  deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
  ::~deque((deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>
            *)(local_3c0 + 0x60));
  std::
  deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
  ::~deque((deque<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<RuntimeSymbol>_>_>_>_>_>
            *)(local_3c0 + 0x10));
  if ((_Head_base<0UL,_Value_*,_false>)local_3c0._8_8_ != (_Head_base<0UL,_Value_*,_false>)0x0) {
    (*(*(_func_int ***)local_3c0._8_8_)[1])();
  }
  if ((long *)local_448._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_448._8_8_ + 8))();
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_408.tokenizer_.token_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)local_3c0,&local_408.tokenizer_.token_.value);
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void testExpression(const std::string expr, double value)
{
  std::stringstream stream{expr};
  Parser parser{stream};
  auto node = parser.parseLogicalExpression();

  Executor executor{};
  node->accept(executor);
  const auto& val = executor.getValue();
  ASSERT_EQ(val->getType(), TypeName::F32);

  NumberValueAnalyser analyser{};
  val->accept(analyser);
  const auto res = analyser.getValue().value();
  EXPECT_DOUBLE_EQ(res, value);
}